

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

void __thiscall cashew::JSPrinter::printStats(JSPrinter *this,Ref stats)

{
  Ref node;
  size_t sVar1;
  bool bVar2;
  bool bVar3;
  Ref *pRVar4;
  ulong uVar5;
  Ref local_38;
  Ref stats_local;
  
  local_38.inst = stats.inst;
  if ((stats.inst)->type == Array) {
    bVar3 = true;
    uVar5 = 0;
    do {
      if (((((local_38.inst)->field_1).arr)->
          super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).usedElements <= uVar5) {
        return;
      }
      pRVar4 = Ref::operator[](&local_38,(uint)uVar5);
      node.inst = pRVar4->inst;
      bVar2 = isNothing(this,node);
      if (!bVar2) {
        if (!bVar3) {
          newline(this);
        }
        print(this,node);
        bVar3 = isDefun(this,node);
        if (!bVar3) {
          bVar3 = endsInBlock(this,node);
          if (!bVar3) {
            bVar3 = isIf(this,node);
            if (!bVar3) {
              maybeSpace(this,';');
              ensure(this,1);
              sVar1 = this->used;
              this->used = sVar1 + 1;
              this->buffer[sVar1] = ';';
            }
          }
        }
        bVar3 = false;
      }
      uVar5 = uVar5 + 1;
    } while ((local_38.inst)->type == Array);
  }
  __assert_fail("isArray()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x199,"size_t cashew::Value::size()");
}

Assistant:

void printStats(Ref stats) {
    bool first = true;
    for (size_t i = 0; i < stats->size(); i++) {
      Ref curr = stats[i];
      if (!isNothing(curr)) {
        if (first) {
          first = false;
        } else {
          newline();
        }
        print(curr);
        if (!isDefun(curr) && !endsInBlock(curr) && !isIf(curr)) {
          emit(';');
        }
      }
    }
  }